

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compress_integral.cpp
# Opt level: O2

void duckdb::IntegralCompressFunction<unsigned_long,unsigned_char>
               (DataChunk *args,ExpressionState *state,Vector *result)

{
  VectorType VVar1;
  idx_t count;
  data_ptr_t pdVar2;
  data_ptr_t pdVar3;
  unsigned_long *puVar4;
  long lVar5;
  uchar *result_data;
  optional_idx oVar6;
  reference pvVar7;
  Vector *vector;
  idx_t iVar8;
  SelectionVector *sel;
  idx_t i_1;
  idx_t i;
  idx_t iVar9;
  undefined1 in_stack_ffffffffffffff68;
  unsigned_long min_val;
  unsigned_long *local_88;
  data_ptr_t local_80;
  optional_idx dict_size;
  data_ptr_t local_70;
  unsigned_long *local_68;
  
  pvVar7 = vector<duckdb::Vector,_true>::get<true>(&args->data,1);
  min_val = *(unsigned_long *)pvVar7->data;
  pvVar7 = vector<duckdb::Vector,_true>::get<true>(&args->data,0);
  count = args->count;
  VVar1 = pvVar7->vector_type;
  local_88 = &min_val;
  if (VVar1 == FLAT_VECTOR) {
    Vector::SetVectorType(result,FLAT_VECTOR);
    result_data = result->data;
    puVar4 = (unsigned_long *)pvVar7->data;
    FlatVector::VerifyFlatVector(pvVar7);
    FlatVector::VerifyFlatVector(result);
    UnaryExecutor::
    ExecuteFlat<unsigned_long,unsigned_char,duckdb::UnaryLambdaWrapper,duckdb::IntegralCompressFunction<unsigned_long,unsigned_char>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(unsigned_long_const&)_1_>
              (puVar4,result_data,count,&pvVar7->validity,&result->validity,&local_88,
               (bool)in_stack_ffffffffffffff68);
  }
  else {
    if (VVar1 == DICTIONARY_VECTOR) {
      dict_size = DictionaryVector::DictionarySize(pvVar7);
      if (((dict_size.index != 0xffffffffffffffff) &&
          (iVar9 = optional_idx::GetIndex(&dict_size), iVar9 * 2 <= count)) &&
         (vector = DictionaryVector::Child(pvVar7), vector->vector_type == FLAT_VECTOR)) {
        local_80 = result->data;
        puVar4 = (unsigned_long *)vector->data;
        iVar9 = optional_idx::GetIndex(&dict_size);
        FlatVector::VerifyFlatVector(vector);
        FlatVector::VerifyFlatVector(result);
        UnaryExecutor::
        ExecuteFlat<unsigned_long,unsigned_char,duckdb::UnaryLambdaWrapper,duckdb::IntegralCompressFunction<unsigned_long,unsigned_char>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(unsigned_long_const&)_1_>
                  (puVar4,local_80,iVar9,&vector->validity,&result->validity,&local_88,
                   (bool)in_stack_ffffffffffffff68);
        sel = DictionaryVector::SelVector(pvVar7);
        iVar9 = optional_idx::GetIndex(&dict_size);
        Vector::Dictionary(result,result,iVar9,sel,count);
        return;
      }
    }
    else if (VVar1 == CONSTANT_VECTOR) {
      Vector::SetVectorType(result,CONSTANT_VECTOR);
      pdVar2 = result->data;
      pdVar3 = pvVar7->data;
      puVar4 = (pvVar7->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if ((puVar4 != (unsigned_long *)0x0) && ((*puVar4 & 1) == 0)) {
        ConstantVector::SetNull(result,true);
        return;
      }
      ConstantVector::SetNull(result,false);
      *pdVar2 = (char)*(undefined4 *)pdVar3 - (char)min_val;
      return;
    }
    UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&dict_size);
    Vector::ToUnifiedFormat(pvVar7,count,(UnifiedVectorFormat *)&dict_size);
    Vector::SetVectorType(result,FLAT_VECTOR);
    oVar6 = dict_size;
    pdVar2 = result->data;
    FlatVector::VerifyFlatVector(result);
    if (local_68 == (unsigned_long *)0x0) {
      for (iVar9 = 0; count != iVar9; iVar9 = iVar9 + 1) {
        lVar5 = *(long *)oVar6.index;
        iVar8 = iVar9;
        if (lVar5 != 0) {
          iVar8 = (idx_t)*(uint *)(lVar5 + iVar9 * 4);
        }
        pdVar2[iVar9] = (char)*(undefined4 *)(local_70 + iVar8 * 8) - (char)min_val;
      }
    }
    else {
      for (iVar9 = 0; count != iVar9; iVar9 = iVar9 + 1) {
        lVar5 = *(long *)oVar6.index;
        iVar8 = iVar9;
        if (lVar5 != 0) {
          iVar8 = (idx_t)*(uint *)(lVar5 + iVar9 * 4);
        }
        if ((local_68[iVar8 >> 6] >> (iVar8 & 0x3f) & 1) == 0) {
          TemplatedValidityMask<unsigned_long>::SetInvalid
                    (&(result->validity).super_TemplatedValidityMask<unsigned_long>,iVar9);
        }
        else {
          pdVar2[iVar9] = (char)*(undefined4 *)(local_70 + iVar8 * 8) - (char)min_val;
        }
      }
    }
    UnifiedVectorFormat::~UnifiedVectorFormat((UnifiedVectorFormat *)&dict_size);
  }
  return;
}

Assistant:

static void IntegralCompressFunction(DataChunk &args, ExpressionState &state, Vector &result) {
	D_ASSERT(args.ColumnCount() == 2);
	D_ASSERT(args.data[1].GetVectorType() == VectorType::CONSTANT_VECTOR);
	const auto min_val = ConstantVector::GetData<INPUT_TYPE>(args.data[1])[0];
	UnaryExecutor::Execute<INPUT_TYPE, RESULT_TYPE>(
	    args.data[0], result, args.size(),
	    [&](const INPUT_TYPE &input) {
		    return TemplatedIntegralCompress<INPUT_TYPE, RESULT_TYPE>::Operation(input, min_val);
	    },
	    FunctionErrors::CANNOT_ERROR);
}